

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O2

int AndersonAcc(KINMem kin_mem,N_Vector gval,N_Vector fv,N_Vector x,N_Vector xold,int iter,
               realtype *R,realtype *gamma)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  int *piVar5;
  realtype *c;
  N_Vector *X;
  N_Vector y;
  int extraout_EAX;
  long lVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  realtype *prVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  realtype *prVar15;
  long lVar16;
  double *pdVar17;
  ulong uVar18;
  long lVar19;
  int nvec;
  ulong uVar20;
  realtype rVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  piVar5 = kin_mem->kin_ipt_map;
  c = kin_mem->kin_cv;
  X = kin_mem->kin_Xv;
  uVar1 = iter - 1;
  lVar6 = (long)(int)uVar1;
  lVar12 = lVar6 % kin_mem->kin_m_aa;
  N_VLinearSum(1.0,gval,-1.0,xold,fv);
  if (0 < iter) {
    N_VLinearSum(1.0,gval,-1.0,kin_mem->kin_gold_aa,kin_mem->kin_dg_aa[lVar12]);
    N_VLinearSum(1.0,fv,-1.0,kin_mem->kin_fold_aa,kin_mem->kin_df_aa[lVar12]);
  }
  N_VScale(1.0,gval,kin_mem->kin_gold_aa);
  N_VScale(1.0,fv,kin_mem->kin_fold_aa);
  if (iter == 1) {
    rVar21 = N_VDotProd(kin_mem->kin_df_aa[lVar12],kin_mem->kin_df_aa[lVar12]);
    if (rVar21 < 0.0) {
      dVar22 = sqrt(rVar21);
    }
    else {
      dVar22 = SQRT(rVar21);
    }
    *R = dVar22;
    N_VScale(1.0 / dVar22,kin_mem->kin_df_aa[lVar12],kin_mem->kin_q_aa[lVar12]);
    *piVar5 = 0;
    lVar13 = 1;
  }
  else {
    if (iter == 0) {
      N_VScale(1.0,gval,x);
      return extraout_EAX;
    }
    lVar13 = (long)iter;
    lVar14 = kin_mem->kin_m_aa;
    if (lVar14 < lVar13) {
      lVar6 = 2;
      lVar16 = 0x10;
      prVar15 = R;
      lVar19 = 0;
      while (lVar19 < lVar14 + -1) {
        lVar2 = lVar19 + 1;
        lVar9 = lVar14 * lVar2;
        dVar22 = R[lVar9 + lVar19];
        dVar3 = R[lVar9 + lVar19 + 1];
        auVar23._8_8_ = dVar22;
        auVar23._0_8_ = dVar3;
        dVar22 = SQRT(dVar22 * dVar22 + dVar3 * dVar3);
        R[lVar9 + lVar19] = dVar22;
        auVar24._8_4_ = SUB84(dVar22,0);
        auVar24._0_8_ = dVar22;
        auVar24._12_4_ = (int)((ulong)dVar22 >> 0x20);
        auVar24 = divpd(auVar23,auVar24);
        R[lVar9 + lVar19 + 1] = 0.0;
        rVar21 = auVar24._0_8_;
        dVar22 = auVar24._8_8_;
        lVar10 = lVar14 * lVar16;
        for (lVar9 = lVar6; lVar9 < lVar14; lVar9 = lVar9 + 1) {
          dVar3 = *(double *)((long)prVar15 + lVar10);
          dVar4 = *(double *)((long)prVar15 + lVar10 + 8);
          *(double *)((long)prVar15 + lVar10) = dVar3 * dVar22 + dVar4 * rVar21;
          ((double *)((long)prVar15 + lVar10))[1] = dVar3 * -rVar21 + dVar4 * dVar22;
          lVar10 = lVar10 + lVar14 * 8;
        }
        N_VLinearSum(dVar22,kin_mem->kin_q_aa[lVar19],rVar21,kin_mem->kin_q_aa[lVar2],
                     kin_mem->kin_vtemp2);
        y = kin_mem->kin_q_aa[lVar2];
        N_VLinearSum(-rVar21,kin_mem->kin_q_aa[lVar19],dVar22,y,y);
        N_VScale(1.0,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[lVar19]);
        lVar6 = lVar6 + 1;
        prVar15 = prVar15 + 1;
        lVar16 = lVar16 + 8;
        lVar19 = lVar2;
        lVar14 = kin_mem->kin_m_aa;
      }
      prVar15 = R + lVar14;
      prVar11 = R;
      for (lVar6 = 1; lVar6 < lVar14; lVar6 = lVar6 + 1) {
        for (lVar16 = 0; lVar14 + -1 != lVar16; lVar16 = lVar16 + 1) {
          prVar11[lVar16] = prVar15[lVar16];
        }
        prVar15 = prVar15 + lVar14;
        prVar11 = prVar11 + lVar14;
      }
      N_VScale(1.0,kin_mem->kin_df_aa[lVar12],kin_mem->kin_vtemp2);
      for (lVar6 = 0; lVar6 < kin_mem->kin_m_aa + -1; lVar6 = lVar6 + 1) {
        rVar21 = N_VDotProd(kin_mem->kin_q_aa[lVar6],kin_mem->kin_vtemp2);
        R[(kin_mem->kin_m_aa + -1) * kin_mem->kin_m_aa + lVar6] = rVar21;
        N_VLinearSum(1.0,kin_mem->kin_vtemp2,-rVar21,kin_mem->kin_q_aa[lVar6],kin_mem->kin_vtemp2);
      }
      rVar21 = N_VDotProd(kin_mem->kin_vtemp2,kin_mem->kin_vtemp2);
      if (rVar21 < 0.0) {
        dVar22 = sqrt(rVar21);
      }
      else {
        dVar22 = SQRT(rVar21);
      }
      lVar6 = kin_mem->kin_m_aa;
      R[lVar6 * lVar6 + -1] = dVar22;
      N_VScale(1.0 / dVar22,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[lVar6 + -1]);
      lVar6 = kin_mem->kin_m_aa;
      piVar7 = piVar5;
      lVar14 = lVar12;
      while (lVar14 = lVar14 + 1, lVar14 < lVar6) {
        *piVar7 = (int)lVar14;
        piVar7 = piVar7 + 1;
      }
      for (iVar8 = 0; iVar8 <= (int)lVar12; iVar8 = iVar8 + 1) {
        *piVar7 = iVar8;
        piVar7 = piVar7 + 1;
      }
    }
    else {
      N_VScale(1.0,kin_mem->kin_df_aa[lVar12],kin_mem->kin_vtemp2);
      uVar20 = 0;
      uVar18 = 0;
      if (0 < (int)uVar1) {
        uVar18 = (ulong)uVar1;
      }
      for (; uVar18 != uVar20; uVar20 = uVar20 + 1) {
        piVar5[uVar20] = (int)uVar20;
        rVar21 = N_VDotProd(kin_mem->kin_q_aa[uVar20],kin_mem->kin_vtemp2);
        *(realtype *)((long)R + uVar20 * 8 + kin_mem->kin_m_aa * lVar6 * 8) = rVar21;
        N_VLinearSum(1.0,kin_mem->kin_vtemp2,-rVar21,kin_mem->kin_q_aa[uVar20],kin_mem->kin_vtemp2);
      }
      rVar21 = N_VDotProd(kin_mem->kin_vtemp2,kin_mem->kin_vtemp2);
      if (rVar21 < 0.0) {
        dVar22 = sqrt(rVar21);
      }
      else {
        dVar22 = SQRT(rVar21);
      }
      R[kin_mem->kin_m_aa * lVar6 + lVar13 + -1] = dVar22;
      N_VScale(1.0 / dVar22,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[lVar12]);
      piVar5[lVar6] = uVar1;
    }
  }
  uVar20 = (ulong)(uint)iter;
  if (kin_mem->kin_m_aa < lVar13) {
    uVar20 = kin_mem->kin_m_aa & 0xffffffff;
  }
  nvec = (int)uVar20;
  iVar8 = N_VDotProdMulti(nvec,fv,kin_mem->kin_q_aa,gamma);
  if (iVar8 == 0) {
    *c = 1.0;
    *X = gval;
    lVar6 = uVar20 * 8;
    prVar11 = gamma + uVar20;
    prVar15 = R + (uVar20 - 1);
    lVar12 = 1;
    while (iVar8 = (int)uVar20, 0 < iVar8) {
      uVar20 = uVar20 - 1;
      lVar13 = kin_mem->kin_m_aa;
      dVar22 = gamma[uVar20];
      pdVar17 = (double *)(lVar13 * lVar6 + (long)prVar15);
      for (lVar14 = 0; iVar8 + (int)lVar14 < nvec; lVar14 = lVar14 + 1) {
        dVar22 = dVar22 - *pdVar17 * prVar11[lVar14];
        gamma[uVar20] = dVar22;
        pdVar17 = pdVar17 + lVar13;
      }
      dVar3 = R[(lVar13 + 1) * uVar20];
      gamma[uVar20] = dVar22 / dVar3;
      c[lVar12] = -(dVar22 / dVar3);
      X[lVar12] = kin_mem->kin_dg_aa[piVar5[uVar20]];
      lVar12 = lVar12 + 1;
      prVar11 = prVar11 + -1;
      prVar15 = prVar15 + -1;
      lVar6 = lVar6 + -8;
    }
    iVar8 = N_VLinearCombination((int)lVar12,c,X,x);
    return iVar8;
  }
  return iVar8;
}

Assistant:

static int AndersonAcc(KINMem kin_mem, N_Vector gval, N_Vector fv, 
		       N_Vector x, N_Vector xold, 
		       int iter, realtype *R, realtype *gamma)
{
  int i_pt, i, j, lAA, retval;
  int *ipt_map;
  realtype alfa;
  realtype a, b, temp, c, s;

  /* local shortcuts for fused vector operation */
  int       nvec=0;
  realtype* cv=kin_mem->kin_cv;
  N_Vector* Xv=kin_mem->kin_Xv;

  ipt_map = kin_mem->kin_ipt_map;
  i_pt = iter-1 - ((iter-1)/kin_mem->kin_m_aa)*kin_mem->kin_m_aa;
  N_VLinearSum(ONE, gval, -1.0, xold, fv);
  if (iter > 0) {
    /* compute dg_new = gval -gval_old*/
    N_VLinearSum(ONE, gval, -1.0, kin_mem->kin_gold_aa, kin_mem->kin_dg_aa[i_pt]);
    /* compute df_new = fval - fval_old */
    N_VLinearSum(ONE, fv, -1.0, kin_mem->kin_fold_aa, kin_mem->kin_df_aa[i_pt]);
  }

  N_VScale(ONE, gval, kin_mem->kin_gold_aa);
  N_VScale(ONE, fv, kin_mem->kin_fold_aa);

  if (iter == 0) {
    N_VScale(ONE, gval, x);
  }
  else {
    if (iter == 1) {
      R[0] = sqrt(N_VDotProd(kin_mem->kin_df_aa[i_pt], kin_mem->kin_df_aa[i_pt]));
      alfa = 1/R[0];
      N_VScale(alfa, kin_mem->kin_df_aa[i_pt], kin_mem->kin_q_aa[i_pt]);
      ipt_map[0] = 0;
    }
    else if (iter <= kin_mem->kin_m_aa) {
      N_VScale(ONE, kin_mem->kin_df_aa[i_pt], kin_mem->kin_vtemp2);
      for (j=0; j < (iter-1); j++) {
        ipt_map[j] = j;
        R[(iter-1)*kin_mem->kin_m_aa+j] = N_VDotProd(kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
        N_VLinearSum(ONE,kin_mem->kin_vtemp2, -R[(iter-1)*kin_mem->kin_m_aa+j], kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
      }
      R[(iter-1)*kin_mem->kin_m_aa+iter-1] = sqrt(N_VDotProd(kin_mem->kin_vtemp2, kin_mem->kin_vtemp2));
      N_VScale((1/R[(iter-1)*kin_mem->kin_m_aa+iter-1]), kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i_pt]);
      ipt_map[iter-1] = iter-1;
    }
    else {
      /* Delete left-most column vector from QR factorization */
      for (i=0; i < kin_mem->kin_m_aa-1; i++) {
        a = R[(i+1)*kin_mem->kin_m_aa + i];
        b = R[(i+1)*kin_mem->kin_m_aa + i+1];
        temp = sqrt(a*a + b*b);
        c = a / temp;
        s = b / temp;
        R[(i+1)*kin_mem->kin_m_aa + i] = temp;
        R[(i+1)*kin_mem->kin_m_aa + i+1] = 0.0;
	/* OK to re-use temp */
        if (i < kin_mem->kin_m_aa-1) {
          for (j = i+2; j < kin_mem->kin_m_aa; j++) {
            a = R[j*kin_mem->kin_m_aa + i];
            b = R[j*kin_mem->kin_m_aa + i+1];
            temp = c * a + s * b;
            R[j*kin_mem->kin_m_aa + i+1] = -s*a + c*b;
            R[j*kin_mem->kin_m_aa + i] = temp;
	  }
	}
        N_VLinearSum(c, kin_mem->kin_q_aa[i], s, kin_mem->kin_q_aa[i+1], kin_mem->kin_vtemp2);
        N_VLinearSum(-s, kin_mem->kin_q_aa[i], c, kin_mem->kin_q_aa[i+1], kin_mem->kin_q_aa[i+1]);
        N_VScale(ONE, kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i]);
      }

      /* Shift R to the left by one. */
      for (i = 1; i < kin_mem->kin_m_aa; i++) {
        for (j = 0; j < kin_mem->kin_m_aa-1; j++) {
          R[(i-1)*kin_mem->kin_m_aa + j] = R[i*kin_mem->kin_m_aa + j];
        }
      }

      /* Add the new df vector */
      N_VScale(ONE, kin_mem->kin_df_aa[i_pt], kin_mem->kin_vtemp2);
      for (j=0; j < (kin_mem->kin_m_aa-1); j++) {
        R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+j] = N_VDotProd(kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
        N_VLinearSum(ONE, kin_mem->kin_vtemp2, -R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+j], kin_mem->kin_q_aa[j],kin_mem->kin_vtemp2);
      }
      R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+kin_mem->kin_m_aa-1] = sqrt(N_VDotProd(kin_mem->kin_vtemp2, kin_mem->kin_vtemp2));
      N_VScale((1/R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+kin_mem->kin_m_aa-1]), kin_mem->kin_vtemp2, kin_mem->kin_q_aa[kin_mem->kin_m_aa-1]);

      /* Update the iteration map */
      j = 0;
      for (i=i_pt+1; i < kin_mem->kin_m_aa; i++)
        ipt_map[j++] = i;
      for (i=0; i < (i_pt+1); i++)
        ipt_map[j++] = i;
    }

    /* Solve least squares problem and update solution */
    lAA = iter;
    if (kin_mem->kin_m_aa < iter) lAA = kin_mem->kin_m_aa;

    retval = N_VDotProdMulti(lAA, fv, kin_mem->kin_q_aa, gamma);
    if (retval != KIN_SUCCESS) return(KIN_VECTOROP_ERR);

    /* set arrays for fused vector operation */
    cv[0] = ONE;
    Xv[0] = gval;
    nvec = 1;

    for (i=lAA-1; i > -1; i--) {
      for (j=i+1; j < lAA; j++) {
        gamma[i] = gamma[i]-R[j*kin_mem->kin_m_aa+i]*gamma[j]; 
      }
      gamma[i] = gamma[i]/R[i*kin_mem->kin_m_aa+i];

      cv[nvec] = -gamma[i];
      Xv[nvec] = kin_mem->kin_dg_aa[ipt_map[i]];
      nvec += 1;
    }

    /* update solution */
    retval = N_VLinearCombination(nvec, cv, Xv, x);
    if (retval != KIN_SUCCESS) return(KIN_VECTOROP_ERR);

  }

  return 0;
}